

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O1

bool Function_Template::form2_Normalize(NormalizeForm2 Normalize)

{
  uchar uVar1;
  uint8_t value;
  bool bVar2;
  value_type_conflict1 *__val;
  vector<unsigned_char,_std::allocator<unsigned_char>_> normalized;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  Image output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  Image local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  ImageTemplate<unsigned_char> local_38;
  
  Unit_Test::intensityArray(&local_50,2);
  Unit_Test::randomImage(&local_78,&local_50);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (&local_38,local_78._width,local_78._height,'\x01','\x01');
  value = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::fill(&local_38,value);
  (*Normalize)(&local_78,&local_38);
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(2);
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + 2;
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0] = '\0';
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = '\0';
  uVar1 = *local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((uVar1 == local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[1]) ||
     ((local_78._width == 1 && (local_78._height == 1)))) {
    local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = uVar1;
    *local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_start = uVar1;
  }
  else {
    local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0] = '\0';
    local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = 0xff;
  }
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  bVar2 = Unit_Test::verifyImage(&local_38,&local_98,true);
  if (local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  local_38._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_38);
  local_78._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_78);
  if (local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool form2_Normalize(NormalizeForm2 Normalize)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        const PenguinV_Image::Image input  = randomImage( intensity );
        PenguinV_Image::Image output( input.width(), input.height() );

        output.fill( intensityValue() );

        Normalize( input, output );

        std::vector < uint8_t > normalized( 2 );

        if( intensity[0] == intensity[1] || (input.width() == 1 && input.height() == 1) ) {
            normalized[0] = normalized[1] = intensity[0];
        }
        else {
            normalized[0] = 0;
            normalized[1] = 255;
        }

        return verifyImage( output, normalized );
    }